

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CtorExceptionTextTest.cpp
# Opt level: O0

void __thiscall WithException::WithException(WithException *this)

{
  allocator<char> local_31;
  string local_30;
  WithException *local_10;
  WithException *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"shit happen",&local_31);
  WithException(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

WithException()
		: WithException("shit happen")
	{
	}